

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

SetEntry * raviX_set_next_entry(Set *set,SetEntry *entry)

{
  int iVar1;
  SetEntry *local_20;
  SetEntry *entry_local;
  Set *set_local;
  
  if (entry == (SetEntry *)0x0) {
    local_20 = set->table;
  }
  else {
    local_20 = entry + 1;
  }
  while( true ) {
    if (local_20 == set->table + set->size) {
      return (SetEntry *)0x0;
    }
    iVar1 = entry_is_present(local_20);
    if (iVar1 != 0) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

SetEntry *raviX_set_next_entry(Set *set, SetEntry *entry)
{
	if (entry == NULL)
		entry = set->table;
	else
		entry = entry + 1;

	for (; entry != set->table + set->size; entry++) {
		if (entry_is_present(entry)) {
			return entry;
		}
	}

	return NULL;
}